

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::MemoryLeakDetector(MemoryLeakDetector *this,MemoryLeakFailure *reporter)

{
  void *pvVar1;
  PlatformSpecificMutex in_RSI;
  SimpleMutex *in_RDI;
  char *in_stack_ffffffffffffffc8;
  MemoryLeakDetectorTable *in_stack_ffffffffffffffe0;
  
  in_RDI->psMtx = &PTR__MemoryLeakDetector_001c4328;
  MemoryLeakOutputStringBuffer::MemoryLeakOutputStringBuffer
            ((MemoryLeakOutputStringBuffer *)0x17f44b);
  MemoryLeakDetectorTable::MemoryLeakDetectorTable(in_stack_ffffffffffffffe0);
  *(undefined1 *)&in_RDI[0x250].psMtx = 1;
  *(undefined4 *)((long)&in_RDI[0x250].psMtx + 4) = 1;
  *(undefined4 *)&in_RDI[2].psMtx = 1;
  *(undefined1 *)&in_RDI[0x251].psMtx = 0;
  in_RDI[1].psMtx = in_RSI;
  pvVar1 = operator_new((size_t)in_RDI,in_stack_ffffffffffffffc8,0x17f49f);
  SimpleMutex::SimpleMutex(in_RDI);
  in_RDI[0x252].psMtx = pvVar1;
  return;
}

Assistant:

MemoryLeakDetector::MemoryLeakDetector(MemoryLeakFailure* reporter)
{
    doAllocationTypeChecking_ = true;
    allocationSequenceNumber_ = 1;
    current_period_ = mem_leak_period_disabled;
    current_allocation_stage_ = 0;
    reporter_ = reporter;
    mutex_ = new SimpleMutex;
}